

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O2

void chatra::String::native_equals
               (NativeCallHandler handler,Thread *thread,ObjectBase *object,StringId name,
               StringId subName,Tuple *args,Reference ret)

{
  Lockable *this;
  ReferenceNode *pRVar1;
  __type _Var2;
  undefined1 local_68 [8];
  string lValue;
  string rValue;
  
  pRVar1 = ((args->super_ObjectBase).super_Object.refsArray.
            super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
            super__Vector_impl_data._M_start)->node;
  if (((pRVar1->type == Object) && (pRVar1->object != (Object *)0x0)) &&
     (pRVar1->object[1]._vptr_Object == clString)) {
    local_68 = (undefined1  [8])&lValue._M_string_length;
    lValue._M_dataplus._M_p = (pointer)0x0;
    lValue._M_string_length._0_1_ = 0;
    SpinLock::lock((SpinLock *)(object + 1));
    std::__cxx11::string::_M_assign((string *)local_68);
    ((__atomic_flag_base *)&object[1].super_Object._vptr_Object)->_M_i = false;
    lValue.field_2._8_8_ = &rValue._M_string_length;
    rValue._M_dataplus._M_p = (pointer)0x0;
    rValue._M_string_length._0_1_ = 0;
    this = &pRVar1->object[1].super_Lockable;
    SpinLock::lock((SpinLock *)this);
    std::__cxx11::string::_M_assign((string *)(lValue.field_2._M_local_buf + 8));
    *(undefined1 *)&(this->lockRequester)._M_i = 0;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_68,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(lValue.field_2._M_local_buf + 8));
    (ret.node)->type = Bool;
    (ret.node)->object = (Object *)0x0;
    ((ret.node)->field_3).vBool = _Var2;
    std::__cxx11::string::~string((string *)(lValue.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_68);
  }
  else {
    (ret.node)->type = Bool;
    (ret.node)->object = (Object *)0x0;
    ((ret.node)->field_3).vBool = false;
  }
  return;
}

Assistant:

void String::native_equals(CHATRA_NATIVE_ARGS) {
	CHATRA_NATIVE_SELF;

	auto value = args.ref(0);
	if (value.isNull() || value.valueType() != ReferenceValueType::Object ||
			value.deref<ObjectBase>().getClass() != getClassStatic()) {
		ret.setBool(false);
		return;
	}

	std::string lValue;
	{
		std::lock_guard<SpinLock> lock(self.lockValue);
		lValue = self.value;
	}

	std::string rValue;
	{
		auto& target = value.deref<String>();
		std::lock_guard<SpinLock> lock(target.lockValue);
		rValue = target.value;
	}

	ret.setBool(lValue == rValue);
}